

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

void __thiscall CTextRender::Init(CTextRender *this)

{
  IGraphics *pIVar1;
  IKernel *pIVar2;
  IInterface *in_RDI;
  FT_Library in_stack_00000050;
  IGraphics *in_stack_00000058;
  CGlyphMap *in_stack_00000060;
  IKernel *in_stack_ffffffffffffffe0;
  
  IInterface::Kernel(in_RDI);
  pIVar1 = IKernel::RequestInterface<IGraphics>(in_stack_ffffffffffffffe0);
  in_RDI[1]._vptr_IInterface = (_func_int **)pIVar1;
  FT_Init_FreeType(in_RDI + 0xd);
  pIVar2 = (IKernel *)operator_new(0x458);
  CGlyphMap::CGlyphMap(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  in_RDI[3].m_pKernel = pIVar2;
  return;
}

Assistant:

void CTextRender::Init()
{
	m_pGraphics = Kernel()->RequestInterface<IGraphics>();
	FT_Init_FreeType(&m_FTLibrary);
	m_pGlyphMap = new CGlyphMap(m_pGraphics, m_FTLibrary);
}